

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

char * kj::_::fill<kj::CappedArray<char,14ul>,kj::FixedArray<char,1ul>>
                 (char *target,CappedArray<char,_14UL> *first,FixedArray<char,_1UL> *rest)

{
  size_t sVar1;
  size_t sVar2;
  
  sVar1 = first->currentSize;
  for (sVar2 = 0; sVar1 != sVar2; sVar2 = sVar2 + 1) {
    target[sVar2] = first->content[sVar2];
  }
  target[sVar2] = rest->content[0];
  return target + sVar2 + 1;
}

Assistant:

inline const T* end() const { return content + currentSize; }